

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.hpp
# Opt level: O0

double __thiscall SimpleConfiguration::deltaF(SimpleConfiguration *this,int n)

{
  double dVar1;
  reference pvVar2;
  double local_20;
  int local_14;
  SimpleConfiguration *pSStack_10;
  int n_local;
  SimpleConfiguration *this_local;
  
  local_14 = n;
  pSStack_10 = this;
  while (this->nCounter < local_14 + 1) {
    this->nCounter = this->nCounter + 1;
    local_20 = fFunc(this,this->nCounter);
    std::vector<double,_std::allocator<double>_>::push_back(&this->fVal,&local_20);
  }
  pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                     (&this->fVal,(long)(local_14 + 1));
  dVar1 = *pvVar2;
  pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](&this->fVal,(long)local_14);
  return dVar1 - *pvVar2;
}

Assistant:

double deltaF(int n) {
        // fVal[n + 1] - f[n]
        while (nCounter < n + 1) {
            ++nCounter; fVal.push_back(fFunc(nCounter));
        }
        return fVal[n + 1] - fVal[n];
    }